

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplashscreen.cpp
# Opt level: O0

bool waitForWidgetMapped(QWidget *widget,int timeout)

{
  bool bVar1;
  int iVar2;
  int in_ESI;
  long in_FS_OFFSET;
  int remaining;
  timespec ts;
  QElapsedTimer timer;
  anon_class_8_1_722b4b82 isMapped;
  ProcessEventsFlag in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  timespec local_38;
  uint local_24;
  QElapsedTimer local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.t1 = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  local_20.t2 = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  QElapsedTimer::QElapsedTimer(&local_20);
  QElapsedTimer::start();
  while (bVar1 = waitForWidgetMapped::anon_class_8_1_722b4b82::operator()
                           ((anon_class_8_1_722b4b82 *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffb4 = in_ESI;
    iVar2 = QElapsedTimer::elapsed();
    iVar2 = in_stack_ffffffffffffffb4 - iVar2;
    if (iVar2 < 1) break;
    QFlags<QEventLoop::ProcessEventsFlag>::QFlags
              ((QFlags<QEventLoop::ProcessEventsFlag> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
    QCoreApplication::processEvents((QFlags_conflict1 *)(ulong)local_24,iVar2);
    QCoreApplication::sendPostedEvents((QObject *)0x0,0);
    local_38.tv_sec = 0;
    local_38.tv_nsec = 10000000;
    nanosleep(&local_38,(timespec *)0x0);
  }
  bVar1 = waitForWidgetMapped::anon_class_8_1_722b4b82::operator()
                    ((anon_class_8_1_722b4b82 *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

static bool waitForWidgetMapped(QWidget *widget, int timeout = 1000)
{
    enum { TimeOutMs = 10 };
    auto isMapped = [widget](){
        return widget->windowHandle() && widget->windowHandle()->isVisible();
    };

    QElapsedTimer timer;
    timer.start();
    while (!isMapped()) {
        const int remaining = timeout - int(timer.elapsed());
        if (remaining <= 0)
            break;
        QCoreApplication::processEvents(QEventLoop::AllEvents, remaining);
        QCoreApplication::sendPostedEvents();
#if defined(Q_OS_WIN)
        Sleep(uint(TimeOutMs));
#else
        struct timespec ts = { TimeOutMs / 1000, (TimeOutMs % 1000) * 1000 * 1000 };
        nanosleep(&ts, nullptr);
#endif
    }
    return isMapped();
}